

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
          *other)

{
  long lVar1;
  ulong uVar2;
  Matrix<double,__1,__1,_0,__1,__1> *rhs;
  double *__s;
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_40;
  Scalar local_38;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar1 = *(long *)(*(long *)(other + 8) + 0x10);
  if ((lVar1 != 0) &&
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar3 / SEXT816(lVar1),0) < 1)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8,lVar1,SUB168(auVar3 % SEXT816(lVar1),0));
    *puVar4 = std::random_device::_M_fini;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (-1 < lVar1) {
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar1,lVar1,1);
    lVar1 = *(long *)(*(long *)(other + 8) + 0x10);
    local_40.m_matrix = (non_const_type)this;
    if (*(long *)(this + 8) != lVar1) {
      if (lVar1 < 0) goto LAB_0013a5db;
      DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar1,lVar1,1);
    }
    uVar2 = ((local_40.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_rows;
    if (-1 < (long)uVar2) {
      rhs = *(Matrix<double,__1,__1,_0,__1,__1> **)(other + 8);
      __s = ((local_40.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_data;
      if (1 < (long)uVar2) {
        memset(__s,0,(uVar2 & 0x7ffffffffffffffe) * 8);
      }
      if ((long)(uVar2 & 0x7ffffffffffffffe) < (long)uVar2) {
        memset((void *)((long)__s + (uVar2 << 3 & 0xfffffffffffffff0)),0,
               (ulong)((uint)(uVar2 << 3) & 8));
      }
      local_38 = 1.0;
      internal::
      generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
      ::scaleAndAddTo<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
                (&local_40,(Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other,rhs,&local_38
                );
      return;
    }
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
                 );
  }
LAB_0013a5db:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }